

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O1

XrResult GenValidUsageInputsXrLocateHandJointsEXT
                   (XrHandTrackerEXT handTracker,XrHandJointsLocateInfoEXT *locateInfo,
                   XrHandJointLocationsEXT *locations)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  ValidateXrHandleResult VVar3;
  XrResult XVar4;
  char *pcVar5;
  long lVar6;
  GenValidUsageXrInstanceInfo *instance_info;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> pVar7;
  string out;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> objects_info;
  ostringstream oss;
  string local_298;
  string local_278;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_258;
  XrHandTrackerEXT local_240;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_238;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_220;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_208;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1f0;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1d8;
  string local_1c0;
  string local_1a0 [3];
  ios_base local_130 [264];
  
  local_258.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_258.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_258.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1a0[0]._M_dataplus._M_p._0_4_ = 0x3b9b9138;
  local_240 = handTracker;
  std::vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>>::
  emplace_back<XrHandTrackerEXT_T*&,XrObjectType>
            ((vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>> *)
             &local_258,&local_240,(XrObjectType *)local_1a0);
  VVar3 = VerifyXrHandTrackerEXTHandle(&local_240);
  if (VVar3 == VALIDATE_XR_HANDLE_SUCCESS) {
    pVar7 = HandleInfo<XrHandTrackerEXT_T_*>::getWithInstanceInfo(&g_handtrackerext_info,local_240);
    instance_info = pVar7.second;
    paVar1 = &local_1a0[0].field_2;
    local_1a0[0]._M_dataplus._M_p = (pointer)paVar1;
    if (locateInfo == (XrHandJointsLocateInfoEXT *)0x0) {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a0,"VUID-xrLocateHandJointsEXT-locateInfo-parameter","");
      local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_298,"xrLocateHandJointsEXT","");
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_1f0,&local_258);
      local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_278,
                 "Invalid NULL for XrHandJointsLocateInfoEXT \"locateInfo\" which is not optional and must be non-NULL"
                 ,"");
      CoreValidLogMessage(instance_info,local_1a0,VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_298,
                          &local_1f0,&local_278);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a0,"xrLocateHandJointsEXT","");
      XVar4 = ValidateXrStruct(instance_info,local_1a0,&local_258,true,true,locateInfo);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0[0]._M_dataplus._M_p != paVar1) {
        operator_delete(local_1a0[0]._M_dataplus._M_p,local_1a0[0].field_2._M_allocated_capacity + 1
                       );
      }
      if (XVar4 != XR_SUCCESS) {
        local_1a0[0]._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1a0,"VUID-xrLocateHandJointsEXT-locateInfo-parameter","");
        local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_298,"xrLocateHandJointsEXT","");
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  (&local_208,&local_258);
        local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_278,"Command xrLocateHandJointsEXT param locateInfo is invalid",
                   "");
        CoreValidLogMessage(instance_info,local_1a0,VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_298,
                            &local_208,&local_278);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != &local_278.field_2) {
          operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
        }
        if (local_208.
            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_208.
                          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_208.
                                super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_208.
                                super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p != &local_298.field_2) {
          operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a0[0]._M_dataplus._M_p != paVar1) {
          operator_delete(local_1a0[0]._M_dataplus._M_p,
                          local_1a0[0].field_2._M_allocated_capacity + 1);
        }
        goto LAB_0025075b;
      }
      if (locations == (XrHandJointLocationsEXT *)0x0) {
        local_1a0[0]._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1a0,"VUID-xrLocateHandJointsEXT-locations-parameter","");
        local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_298,"xrLocateHandJointsEXT","");
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  (&local_220,&local_258);
        local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_278,
                   "Invalid NULL for XrHandJointLocationsEXT \"locations\" which is not optional and must be non-NULL"
                   ,"");
        CoreValidLogMessage(instance_info,local_1a0,VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_298,
                            &local_220,&local_278);
        local_1f0.
        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
        _M_impl.super__Vector_impl_data._M_start =
             local_220.
             super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_1f0.
        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage =
             local_220.
             super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != &local_278.field_2) {
          operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
          local_1f0.
          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
          _M_impl.super__Vector_impl_data._M_start =
               local_220.
               super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
               ._M_impl.super__Vector_impl_data._M_start;
          local_1f0.
          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage =
               local_220.
               super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
        }
      }
      else {
        local_1a0[0]._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1a0,"xrLocateHandJointsEXT","");
        XVar4 = ValidateXrStruct(instance_info,local_1a0,&local_258,false,true,locations);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a0[0]._M_dataplus._M_p != paVar1) {
          operator_delete(local_1a0[0]._M_dataplus._M_p,
                          local_1a0[0].field_2._M_allocated_capacity + 1);
        }
        if (XVar4 == XR_SUCCESS) {
          XVar4 = XR_SUCCESS;
          goto LAB_0025075b;
        }
        local_1a0[0]._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1a0,"VUID-xrLocateHandJointsEXT-locations-parameter","");
        local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_298,"xrLocateHandJointsEXT","");
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  (&local_238,&local_258);
        local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_278,"Command xrLocateHandJointsEXT param locations is invalid",
                   "");
        CoreValidLogMessage(instance_info,local_1a0,VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_298,
                            &local_238,&local_278);
        local_1f0.
        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
        _M_impl.super__Vector_impl_data._M_start =
             local_238.
             super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_1f0.
        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage =
             local_238.
             super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != &local_278.field_2) {
          operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
          local_1f0.
          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
          _M_impl.super__Vector_impl_data._M_start =
               local_238.
               super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
               ._M_impl.super__Vector_impl_data._M_start;
          local_1f0.
          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage =
               local_238.
               super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
        }
      }
    }
    if (local_1f0.
        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1f0.
                      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_1f0.
                            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1f0.
                            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != &local_298.field_2) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_1a0[0]._M_dataplus._M_p,local_1a0[0].field_2._M_allocated_capacity + 1);
    }
    XVar4 = XR_ERROR_VALIDATION_FAILURE;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,"Invalid XrHandTrackerEXT handle \"handTracker\" ",0x2e);
    local_278._M_dataplus._M_p = (pointer)local_240;
    paVar1 = &local_298.field_2;
    local_298._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct((ulong)&local_298,'\x12');
    *local_298._M_dataplus._M_p = '0';
    local_298._M_dataplus._M_p[1] = 'x';
    pcVar5 = local_298._M_dataplus._M_p + (local_298._M_string_length - 1);
    lVar6 = 0;
    do {
      bVar2 = *(byte *)((long)&local_278._M_dataplus._M_p + lVar6);
      *pcVar5 = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar2 & 0xf];
      pcVar5[-1] = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar2 >> 4];
      lVar6 = lVar6 + 1;
      pcVar5 = pcVar5 + -2;
    } while (lVar6 != 8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,local_298._M_dataplus._M_p,local_298._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != paVar1) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    local_298._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_298,"VUID-xrLocateHandJointsEXT-handTracker-parameter","");
    local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"xrLocateHandJointsEXT","")
    ;
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              (&local_1d8,&local_258);
    std::__cxx11::stringbuf::str();
    CoreValidLogMessage((GenValidUsageXrInstanceInfo *)0x0,&local_298,
                        VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_278,&local_1d8,&local_1c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
    }
    if (local_1d8.
        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1d8.
                      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_1d8.
                            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1d8.
                            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != paVar1) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
    std::ios_base::~ios_base(local_130);
    XVar4 = XR_ERROR_HANDLE_INVALID;
  }
LAB_0025075b:
  if (local_258.
      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_258.
                    super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_258.
                          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_258.
                          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return XVar4;
}

Assistant:

XrResult GenValidUsageInputsXrLocateHandJointsEXT(
XrHandTrackerEXT handTracker,
const XrHandJointsLocateInfoEXT* locateInfo,
XrHandJointLocationsEXT* locations) {
    try {
        XrResult xr_result = XR_SUCCESS;
        std::vector<GenValidUsageXrObjectInfo> objects_info;
        objects_info.emplace_back(handTracker, XR_OBJECT_TYPE_HAND_TRACKER_EXT);

        {
            // writeValidateInlineHandleValidation
            ValidateXrHandleResult handle_result = VerifyXrHandTrackerEXTHandle(&handTracker);
            if (handle_result != VALIDATE_XR_HANDLE_SUCCESS) {
                // Not a valid handle or NULL (which is not valid in this case)
                std::ostringstream oss;
                oss << "Invalid XrHandTrackerEXT handle \"handTracker\" ";
                oss << HandleToHexString(handTracker);
                CoreValidLogMessage(nullptr, "VUID-xrLocateHandJointsEXT-handTracker-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrLocateHandJointsEXT",
                                    objects_info, oss.str());
                return XR_ERROR_HANDLE_INVALID;
            }
        }
        auto info_with_instance = g_handtrackerext_info.getWithInstanceInfo(handTracker);
        GenValidUsageXrHandleInfo *gen_handtrackerext_info = info_with_instance.first;
        (void)gen_handtrackerext_info;  // quiet warnings
        GenValidUsageXrInstanceInfo *gen_instance_info = info_with_instance.second;
        (void)gen_instance_info;  // quiet warnings
        // Non-optional pointer/array variable that needs to not be NULL
        if (nullptr == locateInfo) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrLocateHandJointsEXT-locateInfo-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrLocateHandJointsEXT", objects_info,
                                "Invalid NULL for XrHandJointsLocateInfoEXT \"locateInfo\" which is not "
                                "optional and must be non-NULL");
            return XR_ERROR_VALIDATION_FAILURE;
        }
        // Validate that the structure XrHandJointsLocateInfoEXT is valid
        xr_result = ValidateXrStruct(gen_instance_info, "xrLocateHandJointsEXT", objects_info,
                                                        true, true, locateInfo);
        if (XR_SUCCESS != xr_result) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrLocateHandJointsEXT-locateInfo-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrLocateHandJointsEXT",
                                objects_info,
                                "Command xrLocateHandJointsEXT param locateInfo is invalid");
            return xr_result;
        }
        // Non-optional pointer/array variable that needs to not be NULL
        if (nullptr == locations) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrLocateHandJointsEXT-locations-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrLocateHandJointsEXT", objects_info,
                                "Invalid NULL for XrHandJointLocationsEXT \"locations\" which is not "
                                "optional and must be non-NULL");
            return XR_ERROR_VALIDATION_FAILURE;
        }
        // Validate that the structure XrHandJointLocationsEXT is valid
        xr_result = ValidateXrStruct(gen_instance_info, "xrLocateHandJointsEXT", objects_info,
                                                        false, true, locations);
        if (XR_SUCCESS != xr_result) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrLocateHandJointsEXT-locations-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrLocateHandJointsEXT",
                                objects_info,
                                "Command xrLocateHandJointsEXT param locations is invalid");
            return xr_result;
        }
        return xr_result;
    } catch (...) {
        return XR_ERROR_VALIDATION_FAILURE;
    }
}